

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

void game::updateDisplay(Game game)

{
  ostream *poVar1;
  int j;
  long lVar2;
  undefined1 *puVar3;
  int i;
  long lVar4;
  undefined1 local_40 [16];
  
  puVar3 = local_40;
  system("clear");
  poVar1 = std::operator<<((ostream *)&std::cout,"0  1  2 ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"----------");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,puVar3[lVar2]);
      std::operator<<(poVar1,"|  ");
    }
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar4);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"----------");
    std::endl<char,std::char_traits<char>>(poVar1);
    puVar3 = puVar3 + 3;
  }
  return;
}

Assistant:

void updateDisplay(const Game game) {
        system("clear");
        std::cout << "0  1  2 " << std::endl;
        std::cout << "----------" << std::endl;
        for (int i = 0; i < 3; i++) {
            for (int j = 0; j < 3; j++) {
                std::cout << game.bord[i][j] << "|  ";
            }
            std::cout << i << std::endl << "----------" << std::endl;
        }
    }